

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int JS_WriteArray(BCWriterState *s,JSValue obj)

{
  int iVar1;
  JSContext *pJVar2;
  bool bVar3;
  uint8_t c;
  int iVar4;
  double dVar5;
  double dVar6;
  JSValue JVar7;
  uint32_t len;
  uint local_3c;
  double local_38;
  
  if ((s->field_0x39 == '\0') || ((*(byte *)((long)obj.u.ptr + 5) & 1) != 0)) {
    bVar3 = true;
    c = '\t';
  }
  else {
    c = '\r';
    bVar3 = false;
  }
  dbuf_putc(&s->dbuf,c);
  iVar4 = js_get_length32(s->ctx,&local_3c,obj);
  if (iVar4 == 0) {
    dVar6 = (double)(ulong)local_3c;
    dbuf_put_leb128(&s->dbuf,local_3c);
    local_38 = dVar6;
    if (dVar6 != 0.0) {
      dVar6 = 0.0;
      do {
        dVar5 = (double)((ulong)dVar6 & 0xffffffff);
        if (-1 < SUB84(dVar6,0)) {
          dVar5 = dVar6;
        }
        JVar7.tag._0_4_ = (uint)((ulong)(long)SUB84(dVar6,0) >> 0x1f) & 7;
        JVar7.u.float64 = dVar5;
        JVar7.tag._4_4_ = 0;
        JVar7 = JS_GetPropertyValue(s->ctx,obj,JVar7);
        if ((uint)JVar7.tag == 6) {
          return -1;
        }
        iVar4 = JS_WriteObjectRec(s,JVar7);
        pJVar2 = s->ctx;
        if ((0xfffffff4 < (uint)JVar7.tag) &&
           (iVar1 = *JVar7.u.ptr, *(int *)JVar7.u.ptr = iVar1 + -1, iVar1 < 2)) {
          __JS_FreeValueRT(pJVar2->rt,JVar7);
        }
        if (iVar4 != 0) {
          return -1;
        }
        dVar6 = (double)((long)dVar6 + 1);
      } while (local_38 != dVar6);
    }
    if (bVar3) {
      return 0;
    }
    JVar7 = JS_GetPropertyInternal(s->ctx,obj,0x70,obj,0);
    if ((uint)JVar7.tag != 6) {
      iVar4 = JS_WriteObjectRec(s,JVar7);
      pJVar2 = s->ctx;
      if ((0xfffffff4 < (uint)JVar7.tag) &&
         (iVar1 = *JVar7.u.ptr, *(int *)JVar7.u.ptr = iVar1 + -1, iVar1 < 2)) {
        __JS_FreeValueRT(pJVar2->rt,JVar7);
      }
      if (iVar4 == 0) {
        return 0;
      }
    }
  }
  return -1;
}

Assistant:

static int JS_WriteArray(BCWriterState *s, JSValueConst obj)
{
    JSObject *p = JS_VALUE_GET_OBJ(obj);
    uint32_t i, len;
    JSValue val;
    int ret;
    BOOL is_template;
    
    if (s->allow_bytecode && !p->extensible) {
        /* not extensible array: we consider it is a
           template when we are saving bytecode */
        bc_put_u8(s, BC_TAG_TEMPLATE_OBJECT);
        is_template = TRUE;
    } else {
        bc_put_u8(s, BC_TAG_ARRAY);
        is_template = FALSE;
    }
    if (js_get_length32(s->ctx, &len, obj))
        goto fail1;
    bc_put_leb128(s, len);
    for(i = 0; i < len; i++) {
        val = JS_GetPropertyUint32(s->ctx, obj, i);
        if (JS_IsException(val))
            goto fail1;
        ret = JS_WriteObjectRec(s, val);
        JS_FreeValue(s->ctx, val);
        if (ret)
            goto fail1;
    }
    if (is_template) {
        val = JS_GetProperty(s->ctx, obj, JS_ATOM_raw);
        if (JS_IsException(val))
            goto fail1;
        ret = JS_WriteObjectRec(s, val);
        JS_FreeValue(s->ctx, val);
        if (ret)
            goto fail1;
    }
    return 0;
 fail1:
    return -1;
}